

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O1

TernaryOp * __thiscall verilogAST::TernaryOp::clone_impl(TernaryOp *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TernaryOp *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pTVar4 = (TernaryOp *)operator_new(0x20);
  iVar1 = (*(((this->cond)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  iVar2 = (*(((this->true_value)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  iVar3 = (*(((this->false_value)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  (pTVar4->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__00176720
  ;
  (pTVar4->cond)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var,iVar1);
  (pTVar4->true_value)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var_00,iVar2);
  (pTVar4->false_value)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var_01,iVar3);
  return pTVar4;
}

Assistant:

virtual TernaryOp* clone_impl() const override {
    return new TernaryOp(this->cond->clone(), this->true_value->clone(),
                         this->false_value->clone());
  }